

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_Hash160BytePubkey_Test::TestBody(HashUtil_Hash160BytePubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b8;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData160 byte_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey target;
  HashUtil_Hash160BytePubkey_Test *this_local;
  
  target.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Hash160((ByteData160 *)&gtest_ar.message_,(Pubkey *)local_28);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_a8,(ByteData160 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"byte_data.GetHex().c_str()",
             "\"d856f6effbdef003119edf5b602ceb4a5947648f\"",pcVar2,
             "d856f6effbdef003119edf5b602ceb4a5947648f");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(HashUtil, Hash160BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData160 byte_data = HashUtil::Hash160(target);
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "d856f6effbdef003119edf5b602ceb4a5947648f");
}